

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

Value * __thiscall
ot::commissioner::Interpreter::ProcessNetwork
          (Value *__return_storage_ptr__,Interpreter *this,Expression *aExpr)

{
  char cVar1;
  ErrorCode EVar2;
  pointer pbVar3;
  bool bVar4;
  Status SVar5;
  Value *pVVar6;
  char *pcVar7;
  reference this_00;
  char *pcVar8;
  format_string_checker<char> *pfVar9;
  string *this_01;
  json *this_02;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string *psVar10;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_args args_05;
  format_args args_06;
  format_args args_07;
  format_args args_08;
  format_args args_09;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  undefined1 local_448 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_430;
  _Alloc_hider local_420;
  code *local_418;
  format_string_checker<char> local_3f8;
  Network nwk;
  vector<unsigned_long,_std::allocator<unsigned_long>_> xpans;
  CommissionerAppPtr commissioner;
  writer write;
  StringArray unresolved;
  StringArray aliases;
  json json;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_2d8;
  string_t local_2c8;
  string local_2a8;
  undefined1 local_288 [40];
  undefined1 local_260 [40];
  undefined1 local_238 [40];
  undefined1 local_210 [40];
  undefined1 local_1e8 [40];
  undefined1 local_1c0 [40];
  undefined1 local_198 [40];
  undefined1 local_170 [40];
  undefined1 local_148 [40];
  undefined1 local_120 [40];
  undefined1 local_f8 [40];
  undefined1 local_d0 [40];
  undefined1 local_a8 [40];
  undefined1 local_80 [40];
  undefined1 local_58 [40];
  
  (__return_storage_ptr__->mError).mCode = kNone;
  (__return_storage_ptr__->mError).mMessage._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mError).mMessage.field_2;
  (__return_storage_ptr__->mError).mMessage._M_string_length = 0;
  (__return_storage_ptr__->mError).mMessage.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->mData)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mData).field_2;
  (__return_storage_ptr__->mData)._M_string_length = 0;
  (__return_storage_ptr__->mData).field_2._M_local_buf[0] = '\0';
  commissioner.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  commissioner.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pbVar3 = (aExpr->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(aExpr->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3) < 0x21) {
    local_448._0_8_ = local_448._0_8_ & 0xffffffff00000000;
    local_448._8_8_ = "too few arguments";
    local_448._16_8_ = (pointer)0x11;
    aStack_430._M_allocated_capacity = 0;
    local_420._M_p = (pointer)0x0;
    pcVar7 = "too few arguments";
    aStack_430._8_8_ = local_448;
    while (pcVar8 = pcVar7, pcVar8 != "") {
      pcVar7 = pcVar8 + 1;
      if (*pcVar8 == '}') {
        if ((pcVar7 == "") || (*pcVar7 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar7 = pcVar8 + 2;
      }
      else if (*pcVar8 == '{') {
        pcVar7 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar8,"",(format_string_checker<char> *)local_448);
      }
    }
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_448;
    ::fmt::v10::vformat_abi_cxx11_
              ((string *)&local_3f8,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),args);
    psVar10 = (string *)(local_58 + 8);
    local_58._0_4_ = kInvalidArgs;
    std::__cxx11::string::string(psVar10,(string *)&local_3f8);
    Value::Value((Value *)&nwk,(Error *)local_58);
LAB_0011b1a0:
    Value::operator=(__return_storage_ptr__,(Value *)&nwk);
    Value::~Value((Value *)&nwk);
    std::__cxx11::string::~string(psVar10);
    pfVar9 = &local_3f8;
  }
  else {
    std::__cxx11::string::string((string *)&nwk,"save",(allocator *)local_448);
    bVar4 = CaseInsensitiveEqual(pbVar3 + 1,(string *)&nwk);
    std::__cxx11::string::~string((string *)&nwk);
    if (bVar4) {
      if ((ulong)((long)(aExpr->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(aExpr->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start) < 0x41) {
        local_448._0_8_ = local_448._0_8_ & 0xffffffff00000000;
        local_448._8_8_ = "too few arguments";
        local_448._16_8_ = (pointer)0x11;
        aStack_430._M_allocated_capacity = 0;
        local_420._M_p = (pointer)0x0;
        pcVar7 = "too few arguments";
        aStack_430._8_8_ = local_448;
        while (pcVar8 = pcVar7, pcVar8 != "") {
          pcVar7 = pcVar8 + 1;
          if (*pcVar8 == '}') {
            if ((pcVar7 == "") || (*pcVar7 != '}')) {
              ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
            }
            pcVar7 = pcVar8 + 2;
          }
          else if (*pcVar8 == '{') {
            pcVar7 = ::fmt::v10::detail::
                     parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                               (pcVar8,"",(format_string_checker<char> *)local_448);
          }
        }
        args_00.field_1.args_ = in_R9.args_;
        args_00.desc_ = (unsigned_long_long)local_448;
        ::fmt::v10::vformat_abi_cxx11_
                  ((string *)&local_3f8,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),
                   args_00);
        psVar10 = (string *)(local_80 + 8);
        local_80._0_4_ = kInvalidArgs;
        std::__cxx11::string::string(psVar10,(string *)&local_3f8);
        Value::Value((Value *)&nwk,(Error *)local_80);
        goto LAB_0011b1a0;
      }
      JobManager::GetSelectedCommissioner
                ((Error *)local_210,
                 (this->mJobManager).
                 super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 ,&commissioner);
      Value::Value((Value *)&nwk,(Error *)local_210);
      pVVar6 = Value::operator=(__return_storage_ptr__,(Value *)&nwk);
      EVar2 = (pVVar6->mError).mCode;
      Value::~Value((Value *)&nwk);
      std::__cxx11::string::~string((string *)(local_210 + 8));
      if (EVar2 != kNone) goto LAB_0011b1cd;
      (*((commissioner.
          super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
        ->super_CommissionerHandler)._vptr_CommissionerHandler[0x10])
                (local_238,
                 commissioner.
                 super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,(aExpr->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + 2);
      Value::Value((Value *)&nwk,(Error *)local_238);
      Value::operator=(__return_storage_ptr__,(Value *)&nwk);
      Value::~Value((Value *)&nwk);
      pfVar9 = (format_string_checker<char> *)(local_238 + 8);
    }
    else {
      pbVar3 = (aExpr->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      std::__cxx11::string::string((string *)&nwk,"sync",(allocator *)local_448);
      bVar4 = CaseInsensitiveEqual(pbVar3 + 1,(string *)&nwk);
      std::__cxx11::string::~string((string *)&nwk);
      if (!bVar4) {
        pbVar3 = (aExpr->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        std::__cxx11::string::string((string *)&nwk,"list",(allocator *)local_448);
        bVar4 = CaseInsensitiveEqual(pbVar3 + 1,(string *)&nwk);
        std::__cxx11::string::~string((string *)&nwk);
        if (bVar4) {
          ProcessNetworkList((Value *)&nwk,this,aExpr);
          Value::operator=(__return_storage_ptr__,(Value *)&nwk);
          Value::~Value((Value *)&nwk);
          goto LAB_0011b1cd;
        }
        pbVar3 = (aExpr->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        std::__cxx11::string::string((string *)&nwk,"select",(allocator *)local_448);
        bVar4 = CaseInsensitiveEqual(pbVar3 + 1,(string *)&nwk);
        std::__cxx11::string::~string((string *)&nwk);
        if (bVar4) {
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::basic_json(&json,(nullptr_t)0x0);
          pbVar3 = (aExpr->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if ((long)(aExpr->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 == 0x60) {
            std::__cxx11::string::string((string *)&nwk,"none",(allocator *)local_448);
            bVar4 = CaseInsensitiveEqual(pbVar3 + 2,(string *)&nwk);
            std::__cxx11::string::~string((string *)&nwk);
            if (bVar4) {
              SVar5 = persistent_storage::Registry::ForgetCurrentNetwork
                                ((this->mRegistry).
                                 super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr);
              if (SVar5 != kSuccess) {
                local_448._0_8_ = local_448._0_8_ & 0xffffffff00000000;
                local_448._8_8_ = "network unselection failed";
                local_448._16_8_ = (pointer)0x1a;
                aStack_430._M_allocated_capacity = 0;
                local_420._M_p = (pointer)0x0;
                pcVar7 = "network unselection failed";
                aStack_430._8_8_ = local_448;
                while (pcVar8 = pcVar7, pcVar8 != "") {
                  pcVar7 = pcVar8 + 1;
                  if (*pcVar8 == '}') {
                    if ((pcVar7 == "") || (*pcVar7 != '}')) {
                      ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
                    }
                    pcVar7 = pcVar8 + 2;
                  }
                  else if (*pcVar8 == '{') {
                    pcVar7 = ::fmt::v10::detail::
                             parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                                       (pcVar8,"",(format_string_checker<char> *)local_448);
                  }
                }
                args_04.field_1.args_ = in_R9.args_;
                args_04.desc_ = (unsigned_long_long)local_448;
                ::fmt::v10::vformat_abi_cxx11_
                          ((string *)&local_3f8,(v10 *)"network unselection failed",
                           (string_view)ZEXT816(0x1a),args_04);
                psVar10 = (string *)(local_d0 + 8);
                local_d0._0_4_ = kRegistryError;
                std::__cxx11::string::string(psVar10,(string *)&local_3f8);
                Value::Value((Value *)&nwk,(Error *)local_d0);
                goto LAB_0011ba4d;
              }
LAB_0011bfc1:
              UpdateNetworkSelectionInfo((Error *)&nwk,this,false);
              pfVar9 = (format_string_checker<char> *)&nwk.mName;
              goto LAB_0011ba75;
            }
            std::__cxx11::string::string
                      ((string *)&nwk,
                       (string *)
                       ((aExpr->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + 2));
            __l._M_len = 1;
            __l._M_array = (iterator)&nwk;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector(&aliases,__l,(allocator_type *)local_448);
            std::__cxx11::string::~string((string *)&nwk);
            xpans.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            xpans.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            xpans.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            unresolved.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            unresolved.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            unresolved.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            SVar5 = persistent_storage::Registry::GetNetworkXpansByAliases
                              ((this->mRegistry).
                               super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr,&aliases,&xpans,&unresolved);
            if (SVar5 == kSuccess) {
              if ((long)xpans.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)xpans.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start == 8) {
                SVar5 = persistent_storage::Registry::SetCurrentNetwork
                                  ((this->mRegistry).
                                   super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr,*xpans.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                if (SVar5 == kSuccess) {
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&unresolved);
                  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                            (&xpans.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&aliases);
                  goto LAB_0011bfc1;
                }
                local_448._0_8_ = local_448._0_8_ & 0xffffffff00000000;
                local_448._8_8_ = "network selection failed";
                local_448._16_8_ = (pointer)0x18;
                aStack_430._M_allocated_capacity = 0;
                local_420._M_p = (pointer)0x0;
                pcVar7 = "network selection failed";
                aStack_430._8_8_ = local_448;
                while (pcVar8 = pcVar7, pcVar8 != "") {
                  pcVar7 = pcVar8 + 1;
                  if (*pcVar8 == '}') {
                    if ((pcVar7 == "") || (*pcVar7 != '}')) {
                      ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
                    }
                    pcVar7 = pcVar8 + 2;
                  }
                  else if (*pcVar8 == '{') {
                    pcVar7 = ::fmt::v10::detail::
                             parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                                       (pcVar8,"",(format_string_checker<char> *)local_448);
                  }
                }
                args_08.field_1.args_ = in_R9.args_;
                args_08.desc_ = (unsigned_long_long)local_448;
                ::fmt::v10::vformat_abi_cxx11_
                          ((string *)&local_3f8,(v10 *)"network selection failed",
                           (string_view)ZEXT816(0x18),args_08);
                psVar10 = (string *)(local_148 + 8);
                local_148._0_4_ = kRegistryError;
                std::__cxx11::string::string(psVar10,(string *)&local_3f8);
                Value::Value((Value *)&nwk,(Error *)local_148);
              }
              else {
                local_448._0_4_ = ulong_long_type;
                local_448._4_4_ = string_type;
                local_448._8_8_ = "Detected {} networks instead of 1 for alias \'{}\'";
                local_448._16_8_ = 0x30;
                aStack_430._M_allocated_capacity = 0x200000000;
                local_420._M_p =
                     (pointer)::fmt::v10::detail::
                              parse_format_specs<unsigned_long,fmt::v10::detail::compile_parse_context<char>>
                ;
                local_418 = ::fmt::v10::detail::
                            parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
                ;
                pcVar7 = "Detected {} networks instead of 1 for alias \'{}\'";
                aStack_430._8_8_ = local_448;
                write.handler_ = (format_string_checker<char> *)local_448;
                while (pcVar7 != "") {
                  cVar1 = *pcVar7;
                  pcVar8 = pcVar7;
                  while (cVar1 != '{') {
                    pcVar8 = pcVar8 + 1;
                    if (pcVar8 == "") {
                      ::fmt::v10::detail::
                      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::writer::operator()((writer *)&write,pcVar7,"");
                      goto LAB_0011bdbd;
                    }
                    cVar1 = *pcVar8;
                  }
                  ::fmt::v10::detail::
                  parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::writer::operator()((writer *)&write,pcVar7,pcVar8);
                  pcVar7 = ::fmt::v10::detail::
                           parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,unsigned_long,std::__cxx11::string>&>
                                     (pcVar8,"",
                                      (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)local_448);
                }
LAB_0011bdbd:
                local_448._0_8_ =
                     (long)xpans.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)xpans.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                           _M_impl.super__Vector_impl_data._M_start >> 3;
                pbVar3 = (aExpr->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                local_448._16_8_ = pbVar3[2]._M_dataplus._M_p;
                aStack_430._M_allocated_capacity = pbVar3[2]._M_string_length;
                fmt_01.size_ = 0xd4;
                fmt_01.data_ = (char *)0x30;
                args_07.field_1.values_ = in_R9.values_;
                args_07.desc_ = (unsigned_long_long)local_448;
                ::fmt::v10::vformat_abi_cxx11_
                          ((string *)&local_3f8,
                           (v10 *)"Detected {} networks instead of 1 for alias \'{}\'",fmt_01,
                           args_07);
                psVar10 = (string *)(local_120 + 8);
                local_120._0_4_ = kIOError;
                std::__cxx11::string::string(psVar10,(string *)&local_3f8);
                Value::Value((Value *)&nwk,(Error *)local_120);
              }
            }
            else {
              local_448._0_4_ = string_type;
              local_448._8_8_ = "Failed to resolve extended PAN Id for network \'{}\'";
              local_448._16_8_ = (pointer)0x32;
              aStack_430._M_allocated_capacity = 0x100000000;
              local_420._M_p =
                   (pointer)::fmt::v10::detail::
                            parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
              ;
              pcVar7 = "Failed to resolve extended PAN Id for network \'{}\'";
              aStack_430._8_8_ = local_448;
              write.handler_ = (format_string_checker<char> *)local_448;
              while (pcVar7 != "") {
                cVar1 = *pcVar7;
                pcVar8 = pcVar7;
                while (cVar1 != '{') {
                  pcVar8 = pcVar8 + 1;
                  if (pcVar8 == "") {
                    ::fmt::v10::detail::
                    parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::writer::operator()(&write,pcVar7,"");
                    goto LAB_0011bb36;
                  }
                  cVar1 = *pcVar8;
                }
                ::fmt::v10::detail::
                parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::writer::operator()(&write,pcVar7,pcVar8);
                pcVar7 = ::fmt::v10::detail::
                         parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                                   (pcVar8,"",(format_string_checker<char> *)local_448);
              }
LAB_0011bb36:
              pbVar3 = (aExpr->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              local_448._0_8_ = pbVar3[2]._M_dataplus._M_p;
              local_448._8_8_ = pbVar3[2]._M_string_length;
              fmt_00.size_ = 0xd;
              fmt_00.data_ = (char *)0x32;
              args_06.field_1.values_ = in_R9.values_;
              args_06.desc_ = (unsigned_long_long)local_448;
              ::fmt::v10::vformat_abi_cxx11_
                        ((string *)&local_3f8,
                         (v10 *)"Failed to resolve extended PAN Id for network \'{}\'",fmt_00,
                         args_06);
              psVar10 = (string *)(local_f8 + 8);
              local_f8._0_4_ = kRegistryError;
              std::__cxx11::string::string(psVar10,(string *)&local_3f8);
              Value::Value((Value *)&nwk,(Error *)local_f8);
            }
            Value::operator=(__return_storage_ptr__,(Value *)&nwk);
            Value::~Value((Value *)&nwk);
            std::__cxx11::string::~string(psVar10);
            std::__cxx11::string::~string((string *)&local_3f8);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&unresolved);
            std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                      (&xpans.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&aliases);
          }
          else {
            local_448._0_8_ = local_448._0_8_ & 0xffffffff00000000;
            local_448._8_8_ = "too many arguments";
            local_448._16_8_ = (pointer)0x12;
            aStack_430._M_allocated_capacity = 0;
            local_420._M_p = (pointer)0x0;
            pcVar7 = "too many arguments";
            aStack_430._8_8_ = local_448;
            while (pcVar8 = pcVar7, pcVar8 != "") {
              pcVar7 = pcVar8 + 1;
              if (*pcVar8 == '}') {
                if ((pcVar7 == "") || (*pcVar7 != '}')) {
                  ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
                }
                pcVar7 = pcVar8 + 2;
              }
              else if (*pcVar8 == '{') {
                pcVar7 = ::fmt::v10::detail::
                         parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                                   (pcVar8,"",(format_string_checker<char> *)local_448);
              }
            }
            args_01.field_1.args_ = in_R9.args_;
            args_01.desc_ = (unsigned_long_long)local_448;
            ::fmt::v10::vformat_abi_cxx11_
                      ((string *)&local_3f8,(v10 *)"too many arguments",(string_view)ZEXT816(0x12),
                       args_01);
            psVar10 = (string *)(local_a8 + 8);
            local_a8._0_4_ = kInvalidArgs;
            std::__cxx11::string::string(psVar10,(string *)&local_3f8);
            Value::Value((Value *)&nwk,(Error *)local_a8);
LAB_0011ba4d:
            Value::operator=(__return_storage_ptr__,(Value *)&nwk);
            Value::~Value((Value *)&nwk);
            std::__cxx11::string::~string(psVar10);
            pfVar9 = &local_3f8;
LAB_0011ba75:
            std::__cxx11::string::~string((string *)pfVar9);
          }
          this_02 = &json;
        }
        else {
          pbVar3 = (aExpr->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          std::__cxx11::string::string((string *)&nwk,"identify",(allocator *)local_448);
          bVar4 = CaseInsensitiveEqual(pbVar3 + 1,(string *)&nwk);
          std::__cxx11::string::~string((string *)&nwk);
          if (!bVar4) {
            local_448._0_4_ = string_type;
            local_448._8_8_ = "\'{}\' is not a valid sub-command";
            local_448._16_8_ = (pointer)0x1f;
            aStack_430._M_allocated_capacity = 0x100000000;
            local_420._M_p =
                 (pointer)::fmt::v10::detail::
                          parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
            ;
            pcVar7 = "\'{}\' is not a valid sub-command";
            aStack_430._8_8_ = local_448;
            while (pcVar8 = pcVar7, pcVar8 != "") {
              pcVar7 = pcVar8 + 1;
              if (*pcVar8 == '}') {
                if ((pcVar7 == "") || (*pcVar7 != '}')) {
                  ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
                }
                pcVar7 = pcVar8 + 2;
              }
              else if (*pcVar8 == '{') {
                pcVar7 = ::fmt::v10::detail::
                         parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                                   (pcVar8,"",(format_string_checker<char> *)local_448);
              }
            }
            pbVar3 = (aExpr->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            local_448._0_8_ = pbVar3[1]._M_dataplus._M_p;
            local_448._8_8_ = pbVar3[1]._M_string_length;
            fmt.size_ = 0xd;
            fmt.data_ = (char *)0x1f;
            args_02.field_1.values_ = in_R9.values_;
            args_02.desc_ = (unsigned_long_long)local_448;
            ::fmt::v10::vformat_abi_cxx11_
                      ((string *)&local_3f8,(v10 *)"\'{}\' is not a valid sub-command",fmt,args_02);
            psVar10 = (string *)(local_1e8 + 8);
            local_1e8._0_4_ = kInvalidCommand;
            std::__cxx11::string::string(psVar10,(string *)&local_3f8);
            Value::Value((Value *)&nwk,(Error *)local_1e8);
            goto LAB_0011b1a0;
          }
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)&unresolved,(nullptr_t)0x0);
          persistent_storage::Network::Network(&nwk);
          aliases.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)&aliases.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
          aliases.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          aliases.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
          if ((long)(aExpr->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(aExpr->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start == 0x40) {
            SVar5 = persistent_storage::Registry::GetCurrentNetwork
                              ((this->mRegistry).
                               super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr,&nwk);
            if (SVar5 != kSuccess) {
              local_3f8.types_[0] = none_type;
              local_3f8.context_.super_basic_format_parse_context<char>.format_str_.data_ =
                   "getting current network failed";
              local_3f8.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x1e;
              local_3f8.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
              local_3f8.context_.super_basic_format_parse_context<char>._20_4_ = 0;
              local_3f8.parse_funcs_[0] = (parse_func)0x0;
              pcVar7 = "getting current network failed";
              local_3f8.context_.types_ = local_3f8.types_;
              while (pcVar8 = pcVar7, pcVar8 != "") {
                pcVar7 = pcVar8 + 1;
                if (*pcVar8 == '}') {
                  if ((pcVar7 == "") || (*pcVar7 != '}')) {
                    ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
                  }
                  pcVar7 = pcVar8 + 2;
                }
                else if (*pcVar8 == '{') {
                  pcVar7 = ::fmt::v10::detail::
                           parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                                     (pcVar8,"",&local_3f8);
                }
              }
              args_05.field_1.values_ = in_R9.values_;
              args_05.desc_ = (unsigned_long_long)&local_3f8;
              ::fmt::v10::vformat_abi_cxx11_
                        ((string *)&xpans,(v10 *)"getting current network failed",
                         (string_view)ZEXT816(0x1e),args_05);
              psVar10 = (string *)(local_198 + 8);
              local_198._0_4_ = kRegistryError;
              std::__cxx11::string::string(psVar10,(string *)&xpans);
              Value::Value((Value *)local_448,(Error *)local_198);
              goto LAB_0011bacd;
            }
            if (nwk.mId.mId == 0xffffffff) {
              std::__cxx11::string::string((string *)&local_2a8,"none",(allocator *)&local_3f8);
              Value::Value((Value *)local_448,&local_2a8);
              Value::operator=(__return_storage_ptr__,(Value *)local_448);
              Value::~Value((Value *)local_448);
              this_01 = &local_2a8;
            }
            else {
              if (nwk.mDomainId.mId != 0xffffffff) {
                SVar5 = persistent_storage::Registry::GetDomainNameByXpan
                                  ((this->mRegistry).
                                   super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr,nwk.mXpan,(string *)&aliases);
                if (SVar5 != kSuccess) {
                  local_3f8.types_[0] = none_type;
                  local_3f8.context_.super_basic_format_parse_context<char>.format_str_.data_ =
                       "Failed to find registry entity of type: domain";
                  local_3f8.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x2e
                  ;
                  local_3f8.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
                  local_3f8.context_.super_basic_format_parse_context<char>._20_4_ = 0;
                  local_3f8.parse_funcs_[0] = (parse_func)0x0;
                  pcVar7 = "Failed to find registry entity of type: domain";
                  local_3f8.context_.types_ = local_3f8.types_;
                  json._0_8_ = &local_3f8;
                  while (pcVar7 != "") {
                    cVar1 = *pcVar7;
                    pcVar8 = pcVar7;
                    while (cVar1 != '{') {
                      pcVar8 = pcVar8 + 1;
                      if (pcVar8 == "") {
                        ::fmt::v10::detail::
                        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>
                        ::writer::operator()((writer *)&json,pcVar7,"");
                        goto LAB_0011bf47;
                      }
                      cVar1 = *pcVar8;
                    }
                    ::fmt::v10::detail::
                    parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>
                    ::writer::operator()((writer *)&json,pcVar7,pcVar8);
                    pcVar7 = ::fmt::v10::detail::
                             parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                                       (pcVar8,"",&local_3f8);
                  }
LAB_0011bf47:
                  args_09.field_1.args_ = in_R9.args_;
                  args_09.desc_ = (unsigned_long_long)&local_3f8;
                  ::fmt::v10::vformat_abi_cxx11_
                            ((string *)&xpans,
                             (v10 *)"Failed to find registry entity of type: domain",
                             (string_view)ZEXT816(0x2e),args_09);
                  psVar10 = (string *)(local_1c0 + 8);
                  local_1c0._0_4_ = kNotFound;
                  std::__cxx11::string::string(psVar10,(string *)&xpans);
                  Value::Value((Value *)local_448,(Error *)local_1c0);
                  goto LAB_0011bacd;
                }
                std::__cxx11::string::push_back((char)&aliases);
              }
              std::__cxx11::string::append((string *)&aliases);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::
              basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        (&local_2d8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &aliases);
              utils::Hex<unsigned_long>((string *)local_448,nwk.mXpan);
              this_00 = nlohmann::
                        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                      *)&unresolved,(key_type *)local_448);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::operator=(this_00,&local_2d8);
              std::__cxx11::string::~string((string *)local_448);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::~basic_json(&local_2d8);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::dump(&local_2c8,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)&unresolved,4,' ',false,strict);
              Value::Value((Value *)local_448,&local_2c8);
              Value::operator=(__return_storage_ptr__,(Value *)local_448);
              Value::~Value((Value *)local_448);
              this_01 = &local_2c8;
            }
          }
          else {
            local_3f8.types_[0] = none_type;
            local_3f8.context_.super_basic_format_parse_context<char>.format_str_.data_ =
                 "too many arguments";
            local_3f8.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x12;
            local_3f8.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
            local_3f8.context_.super_basic_format_parse_context<char>._20_4_ = 0;
            local_3f8.parse_funcs_[0] = (parse_func)0x0;
            pcVar7 = "too many arguments";
            local_3f8.context_.types_ = local_3f8.types_;
            while (pcVar8 = pcVar7, pcVar8 != "") {
              pcVar7 = pcVar8 + 1;
              if (*pcVar8 == '}') {
                if ((pcVar7 == "") || (*pcVar7 != '}')) {
                  ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
                }
                pcVar7 = pcVar8 + 2;
              }
              else if (*pcVar8 == '{') {
                pcVar7 = ::fmt::v10::detail::
                         parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                                   (pcVar8,"",&local_3f8);
              }
            }
            args_03.field_1.values_ = in_R9.values_;
            args_03.desc_ = (unsigned_long_long)&local_3f8;
            ::fmt::v10::vformat_abi_cxx11_
                      ((string *)&xpans,(v10 *)"too many arguments",(string_view)ZEXT816(0x12),
                       args_03);
            psVar10 = (string *)(local_170 + 8);
            local_170._0_4_ = kInvalidArgs;
            std::__cxx11::string::string(psVar10,(string *)&xpans);
            Value::Value((Value *)local_448,(Error *)local_170);
LAB_0011bacd:
            Value::operator=(__return_storage_ptr__,(Value *)local_448);
            Value::~Value((Value *)local_448);
            std::__cxx11::string::~string(psVar10);
            this_01 = (string *)&xpans;
          }
          std::__cxx11::string::~string((string *)this_01);
          std::__cxx11::string::~string((string *)&aliases);
          persistent_storage::Network::~Network(&nwk);
          this_02 = (json *)&unresolved;
        }
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::~basic_json(this_02);
        goto LAB_0011b1cd;
      }
      JobManager::GetSelectedCommissioner
                ((Error *)local_260,
                 (this->mJobManager).
                 super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 ,&commissioner);
      Value::Value((Value *)&nwk,(Error *)local_260);
      pVVar6 = Value::operator=(__return_storage_ptr__,(Value *)&nwk);
      EVar2 = (pVVar6->mError).mCode;
      Value::~Value((Value *)&nwk);
      std::__cxx11::string::~string((string *)(local_260 + 8));
      if (EVar2 != kNone) goto LAB_0011b1cd;
      (*((commissioner.
          super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
        ->super_CommissionerHandler)._vptr_CommissionerHandler[0x11])(local_288);
      Value::Value((Value *)&nwk,(Error *)local_288);
      Value::operator=(__return_storage_ptr__,(Value *)&nwk);
      Value::~Value((Value *)&nwk);
      pfVar9 = (format_string_checker<char> *)(local_288 + 8);
    }
  }
  std::__cxx11::string::~string((string *)pfVar9);
LAB_0011b1cd:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&commissioner.
              super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::ProcessNetwork(const Expression &aExpr)
{
    using namespace ot::commissioner::persistent_storage;

    Value              value;
    CommissionerAppPtr commissioner = nullptr;

    VerifyOrExit(aExpr.size() >= 2, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));

    if (CaseInsensitiveEqual(aExpr[1], "save"))
    {
        VerifyOrExit(aExpr.size() >= 3, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
        SuccessOrExit(value = mJobManager->GetSelectedCommissioner(commissioner));
        SuccessOrExit(value = commissioner->SaveNetworkData(aExpr[2]));
    }
    else if (CaseInsensitiveEqual(aExpr[1], "sync"))
    {
        SuccessOrExit(value = mJobManager->GetSelectedCommissioner(commissioner));
        SuccessOrExit(value = commissioner->SyncNetworkData());
    }
    else if (CaseInsensitiveEqual(aExpr[1], "list"))
    {
        SuccessOrExit(value = ProcessNetworkList(aExpr));
    }
    else if (CaseInsensitiveEqual(aExpr[1], "select"))
    {
        ::nlohmann::json json;

        VerifyOrExit(aExpr.size() == 3, value = ERROR_INVALID_ARGS(SYNTAX_MANY_ARGS));
        if (CaseInsensitiveEqual(aExpr[2], "none"))
        {
            RegistryStatus status = mRegistry->ForgetCurrentNetwork();
            VerifyOrExit(status == RegistryStatus::kSuccess,
                         value = ERROR_REGISTRY_ERROR("network unselection failed"));
        }
        else
        {
            StringArray           aliases = {aExpr[2]};
            std::vector<uint64_t> xpans;
            StringArray           unresolved;
            VerifyOrExit(mRegistry->GetNetworkXpansByAliases(aliases, xpans, unresolved) == RegistryStatus::kSuccess,
                         value = ERROR_REGISTRY_ERROR("Failed to resolve extended PAN Id for network '{}'", aExpr[2]));
            VerifyOrExit(xpans.size() == 1, value = ERROR_IO_ERROR("Detected {} networks instead of 1 for alias '{}'",
                                                                   xpans.size(), aExpr[2]));
            VerifyOrExit(mRegistry->SetCurrentNetwork(xpans[0]) == RegistryStatus::kSuccess,
                         value = ERROR_REGISTRY_ERROR("network selection failed"));
        }
        // update console prompt after network selection/deselection
        SuccessOrExit(UpdateNetworkSelectionInfo());
    }
    else if (CaseInsensitiveEqual(aExpr[1], "identify"))
    {
        ::nlohmann::json json;
        Network          nwk;
        std::string      nwkData;

        VerifyOrExit(aExpr.size() == 2, value = ERROR_INVALID_ARGS(SYNTAX_MANY_ARGS));
        VerifyOrExit(mRegistry->GetCurrentNetwork(nwk) == RegistryStatus::kSuccess,
                     value = ERROR_REGISTRY_ERROR(RUNTIME_CUR_NETWORK_FAILED));
        if (nwk.mId.mId == EMPTY_ID)
        {
            value = std::string("none");
        }
        else
        {
            if (nwk.mDomainId.mId != EMPTY_ID)
            {
                VerifyOrExit(mRegistry->GetDomainNameByXpan(nwk.mXpan, nwkData) == RegistryStatus::kSuccess,
                             value = ERROR_NOT_FOUND(NOT_FOUND_STR DOMAIN_STR));
                nwkData += '/';
            }
            nwkData += nwk.mName;
            json[utils::Hex(nwk.mXpan)] = nwkData;
            value                       = json.dump(JSON_INDENT_DEFAULT);
        }
    }
    else
    {
        ExitNow(value = ERROR_INVALID_COMMAND(SYNTAX_INVALID_SUBCOMMAND, aExpr[1]));
    }

exit:
    return value;
}